

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

int collision(tgestate_t *state)

{
  ushort uVar1;
  long lVar2;
  char cVar3;
  vischar_t *pvVar4;
  byte bVar5;
  byte bVar6;
  short sVar7;
  uint uVar9;
  long lVar10;
  bool bVar11;
  ushort uVar8;
  
  lVar10 = 0x3c0;
  cVar3 = -8;
  do {
    if (-1 < *(char *)((long)state->jmpbuf_main[0].__jmpbuf + lVar10 + -0x1f)) {
      uVar8 = *(ushort *)((long)state->jmpbuf_main[0].__jmpbuf + lVar10);
      uVar1 = (state->saved_mappos).pos16.u;
      uVar9 = uVar8 + 4;
      if ((uVar9 == uVar1) || ((int)(uVar8 - 4) <= (int)(uint)uVar1 && uVar1 <= uVar9)) {
        uVar8 = *(ushort *)((long)state->jmpbuf_main[0].__jmpbuf + lVar10 + 2);
        uVar1 = (state->saved_mappos).pos16.v;
        uVar9 = uVar8 + 4;
        if (((uVar9 == uVar1) || ((int)(uVar8 - 4) <= (int)(uint)uVar1 && uVar1 <= uVar9)) &&
           (bVar5 = *(char *)((long)&state->saved_mappos + 4) -
                    *(char *)((long)state->jmpbuf_main[0].__jmpbuf + lVar10 + 4),
           bVar6 = (char)bVar5 >> 7, (char)((bVar5 ^ bVar6) - bVar6) < '\x18')) {
          pvVar4 = state->IY;
          if ((lVar10 == 0x3c0) && ((pvVar4->flags & 0xf) == 1)) {
            if (pvVar4->character != state->bribed_character) {
              solitary(state);
              return 0;
            }
            accept_bribe(state);
            pvVar4 = state->IY;
          }
          bVar5 = *(byte *)((long)state->jmpbuf_main[0].__jmpbuf + lVar10 + -0x20);
          if (0x19 < bVar5) {
            bVar11 = bVar5 == 0x1c;
            uVar9 = 0x23;
            if (bVar11) {
              uVar9 = 0x36;
            }
            bVar5 = bVar11 ^ pvVar4->direction;
            if (bVar5 < 4) {
              lVar2 = (ulong)!bVar11 * 2 + 0x20;
              switch(bVar5) {
              case 0:
                uVar8 = *(ushort *)((long)state->jmpbuf_main[0].__jmpbuf + lVar10 + lVar2 + -0x20);
                if (uVar9 != (byte)uVar8) {
                  if (uVar9 < (byte)uVar8) goto LAB_0010863b;
LAB_0010864b:
                  sVar7 = uVar8 + 1;
                  goto LAB_0010864d;
                }
                break;
              case 1:
                uVar8 = *(ushort *)((long)state->jmpbuf_main[0].__jmpbuf + lVar10 + lVar2 + -0x20);
                if (uVar9 + 7 != (uint)uVar8) goto LAB_0010864b;
                break;
              case 2:
                sVar7 = (short)uVar9 + -7;
LAB_0010864d:
                *(short *)((long)state->jmpbuf_main[0].__jmpbuf + lVar10 + lVar2 + -0x20) = sVar7;
                break;
              case 3:
                uVar8 = *(ushort *)((long)state->jmpbuf_main[0].__jmpbuf + lVar10 + lVar2 + -0x20);
                if (uVar9 - 7 != (uint)uVar8) {
LAB_0010863b:
                  sVar7 = uVar8 - 1;
                  goto LAB_0010864d;
                }
              }
            }
          }
          if ((*(byte *)((long)state->jmpbuf_main[0].__jmpbuf + lVar10 + -7) & 0x7f) == 0) {
            bVar5 = pvVar4->direction;
          }
          else {
            bVar5 = pvVar4->direction;
            if ((*(byte *)((long)state->jmpbuf_main[0].__jmpbuf + lVar10 + -6) ^ bVar5) != 2) {
              pvVar4->input = 0x80;
              bVar5 = pvVar4->counter_and_flags;
              goto LAB_0010869a;
            }
          }
          pvVar4->input = collision::new_inputs[bVar5 & 3];
          if ((bVar5 & 1) == 0) {
            bVar5 = pvVar4->counter_and_flags & 0xdf;
          }
          else {
            bVar5 = pvVar4->counter_and_flags | 0x20;
          }
LAB_0010869a:
          pvVar4->counter_and_flags = bVar5 & 0xf0 | 5;
          return 1;
        }
      }
    }
    lVar10 = lVar10 + 0x40;
    cVar3 = cVar3 + '\x01';
    if (cVar3 == '\0') {
      return 0;
    }
  } while( true );
}

Assistant:

int collision(tgestate_t *state)
{
  vischar_t  *vischar;        /* was HL */
  uint8_t     iters;          /* was B */
  uint16_t    u;              /* was BC */
  uint16_t    v;              /* was BC */
  uint16_t    saved_u;        /* was HL */
  uint16_t    saved_v;        /* was HL */
  int8_t      delta;          /* was A */
  uint8_t     coord;          /* was A */
  character_t character;      /* was A */
  uint8_t     range;          /* was B */
  uint8_t     centre;         /* was C */
  uint8_t     input;          /* was A */
  uint8_t     direction;      /* was A */
  uint16_t    new_direction;  /* was BC */

  assert(state != NULL);
  ASSERT_VISCHAR_VALID(state->IY);

  /* Iterate over characters being collided with (e.g. stove). */
  vischar = &state->vischars[0];
  iters = vischars_LENGTH;
  do
  {
    if (vischar->flags & vischar_FLAGS_NO_COLLIDE)
      goto next;

    /* Test for contact between the current vischar and saved_mappos (which is
     * set on entry either from a vischar or a characterstruct).
     *
     * For contact to occur the vischar being tested must be positioned
     * within (-4..+4) on the x and y axis and within (-23..23) on the height
     * axis.
     */

    u = vischar->mi.mappos.u; /* Conv: Moved +4 forward. */
    saved_u = state->saved_mappos.pos16.u;
    if (saved_u != u + 4) /* redundant check */
      if (saved_u > u + 4 || saved_u < u - 4) /* Conv: Removed redundant reload. */
        goto next; /* no x collision */

    v = vischar->mi.mappos.v; /* Conv: Moved +4 forward. */
    saved_v = state->saved_mappos.pos16.v;
    if (saved_v != v + 4) /* redundant check */
      if (saved_v > v + 4 || saved_v < v - 4) /* Conv: Removed redundant reload. */
        goto next; /* no y collision */

    /* Ensure that the heights are within 24 of each other. This will stop
     * the character colliding with any guards high up in watchtowers.
     * Note: Signed result. */
    delta = state->saved_mappos.pos16.w - vischar->mi.mappos.w;
    if (delta < 0)
      delta = -delta; /* absolute value */
    if (delta >= 24)
      goto next;

    /* Check for pursuit. */


    /* If vischar IY is pursuing... */
    if ((state->IY->flags & vischar_FLAGS_PURSUIT_MASK) == vischar_PURSUIT_PURSUE)
    {
      /* ...and the current vischar is the hero... */
      if (vischar == &state->vischars[0])
      {
        if (state->IY->character == state->bribed_character)
        {
          /* Vischar IY is a bribed character pursuing the hero.
           * When the pursuer catches the hero the bribe will be accepted. */
          accept_bribe(state);
        }
        else
        {
          /* Vischar IY is a hostile who's caught the hero! */
          /* Conv: Removed "HL = IY + 1" code which has no effect. */
          solitary(state);
          NEVER_RETURNS 0;
        }
      }
    }

    /*
     * Check for collisions with items.
     */

    /* If it's an item... */
    character = vischar->character;
    if (character >= character_26_STOVE_1)
    {
      uint16_t *pcoord; /* was HL */

      /* Movable items: Stove 1, Stove 2 or Crate */

      pcoord = &vischar->mi.mappos.v;

      /* By default, setup for the stove.
       * It can move on the Y axis only (bottom left to top right). */
      range = 7; /* permitted range from centre point */
      centre = 35; /* centre point (object will move from 29 to 42) */
      direction = state->IY->direction; /* was interleaved */
      if (character == character_28_CRATE)
      {
        /* Setup for the crate.
         * It can move on the X axis only (top left to bottom right). */
        pcoord--; /* point at vischar->mi.pos.x */
        centre = 54; /* centre point (object will move from 47 to 61) */
        direction ^= 1; /* swap axis: left<=>right */
      }

      switch (direction)
      {
        case direction_TOP_LEFT:
          /* The player is pushing the movable item from its front, so centre
           * it. */
          coord = *pcoord; /* Conv: Original code loads a byte here. */
          if (coord != centre)
          {
            /* Conv: This was the [-2]+1 pattern. */
            if (coord > centre)
              (*pcoord)--;
            else
              (*pcoord)++;
          }
          break;

        case direction_TOP_RIGHT:
          if (*pcoord != (centre + range))
            (*pcoord)++;
          break;

        case direction_BOTTOM_RIGHT:
          /* Note: This case happens in the game. */
          *pcoord = centre - range;
          break;

        case direction_BOTTOM_LEFT:
          if (*pcoord != (centre - range))
            (*pcoord)--;
          break;

        default:
          assert("Should not happen" == NULL);
          break;
      }
    }

    /*
     * Check for collisions with characters.
     */

    input = vischar->input & ~input_KICK;
    if (input)
    {
      assert(input < 9); // TODO: Add an input_XXX symbol for '9'

      /* Swap direction top <=> bottom, then compare. */
      if ((vischar->direction ^ 2) != state->IY->direction)
      {
        /* The characters collided while facing away from each other. */

        state->IY->input = input_KICK; /* force an update */

collided_set_delay:
        /* Delay calling character_behaviour() for five turns. This delay
         * controls how long it takes before a blocked character will try
         * another direction. */
        state->IY->counter_and_flags = (state->IY->counter_and_flags & ~vischar_BYTE7_COUNTER_MASK) | 5;
        return 1; /* collided */
      }
    }

    /* Pick a new direction for the vischar at state->IY. */
    {
      /** $B0F8: Inputs which move the character in the next anticlockwise
       *         direction. */
      static const uint8_t new_inputs[4] =
      {
        input_DOWN + input_LEFT  + input_KICK, /* if facing TL, move D+L */
        input_UP   + input_LEFT  + input_KICK, /* if facing TR, move U+L */
        input_UP   + input_RIGHT + input_KICK, /* if facing BR, move U+R */
        input_DOWN + input_RIGHT + input_KICK  /* if facing BL, move D+R */
      };

      /* BUG FIX: Mask 'direction' so that we don't access out-of-bounds in
       * new_inputs[] if we collide when crawling. */
      new_direction = state->IY->direction & vischar_DIRECTION_MASK;
      assert(new_direction < 4);
      state->IY->input = new_inputs[new_direction];
      assert((state->IY->input & ~input_KICK) < 9);
      if ((new_direction & 1) == 0) /* if was facing TL or BR */
        state->IY->counter_and_flags &= ~vischar_BYTE7_V_DOMINANT;
      else
      state->IY->counter_and_flags |= vischar_BYTE7_V_DOMINANT;
    }

    goto collided_set_delay;

next:
    vischar++;
  }
  while (--iters);

  return 0; /* no collision */
}